

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaBlockMetadata::PrintDetailedMap_Begin
          (VmaBlockMetadata *this,VmaJsonWriter *json,VkDeviceSize unusedBytes,
          size_t allocationCount,size_t unusedRangeCount)

{
  VmaJsonWriter *in_RCX;
  VmaJsonWriter *in_RSI;
  VmaBlockMetadata *in_RDI;
  size_t in_R8;
  VmaJsonWriter *in_stack_ffffffffffffffd0;
  undefined1 singleLine;
  
  VmaJsonWriter::WriteString(in_stack_ffffffffffffffd0,(char *)in_RDI);
  GetSize(in_RDI);
  VmaJsonWriter::WriteNumber(in_RSI,(uint64_t)in_RDI);
  VmaJsonWriter::WriteString(in_RSI,(char *)in_RDI);
  VmaJsonWriter::WriteSize(in_RCX,in_R8);
  VmaJsonWriter::WriteString(in_RSI,(char *)in_RDI);
  VmaJsonWriter::WriteSize(in_RCX,in_R8);
  VmaJsonWriter::WriteString(in_RSI,(char *)in_RDI);
  VmaJsonWriter::WriteSize(in_RCX,in_R8);
  singleLine = (undefined1)(in_R8 >> 0x38);
  VmaJsonWriter::WriteString(in_RSI,(char *)in_RDI);
  VmaJsonWriter::BeginArray(in_RCX,(bool)singleLine);
  return;
}

Assistant:

void VmaBlockMetadata::PrintDetailedMap_Begin(class VmaJsonWriter& json,
    VkDeviceSize unusedBytes, size_t allocationCount, size_t unusedRangeCount) const
{
    json.WriteString("TotalBytes");
    json.WriteNumber(GetSize());

    json.WriteString("UnusedBytes");
    json.WriteSize(unusedBytes);

    json.WriteString("Allocations");
    json.WriteSize(allocationCount);

    json.WriteString("UnusedRanges");
    json.WriteSize(unusedRangeCount);

    json.WriteString("Suballocations");
    json.BeginArray();
}